

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O0

bool QtGuiTest::synthesizeKeyEvent
               (QWindow *window,Type t,int k,KeyboardModifiers mods,QString *text,bool autorep,
               ushort count)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  QDebug *o;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QDebug *in_RDI;
  QString *in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  ushort in_stack_00000008;
  bool result;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff04;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined4 in_stack_ffffffffffffff20;
  Type in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  Type in_stack_ffffffffffffff2c;
  QWindow *in_stack_ffffffffffffff30;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_ffffffffffffff3c;
  QDebug local_c0;
  char *in_stack_ffffffffffffff48;
  ushort in_stack_ffffffffffffff50;
  QDebug local_98;
  undefined4 local_90;
  undefined4 local_8c;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  undefined4 local_3c;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_R9B & 1;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  local_3c = in_ECX;
  lcQtGuiTest();
  anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff06,
                                     CONCAT15(in_stack_ffffffffffffff05,
                                              CONCAT14(in_stack_ffffffffffffff04,
                                                       in_stack_ffffffffffffff00)))),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
    anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x4246ed);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_ESI,in_EDX),(char *)in_R8,
               CONCAT13(bVar1,CONCAT12(in_stack_ffffffffffffff06,
                                       CONCAT11(in_stack_ffffffffffffff05,in_stack_ffffffffffffff04)
                                      )),
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (char *)0x424706);
    QMessageLogger::debug();
    o = QDebug::operator<<(in_RDI,in_stack_ffffffffffffff48);
    QDebug::QDebug(&local_60,o);
    ::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff24);
    ::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff24);
    local_8c = local_3c;
    operator<<<QFlags<Qt::KeyboardModifier>,_true>
              ((QDebug *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (QFlags<Qt::KeyboardModifier>)in_stack_ffffffffffffff3c.i);
    QDebug::operator<<((QDebug *)CONCAT44(in_ESI,in_EDX),in_R8);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_68);
    local_10 = 0;
  }
  local_90 = local_3c;
  uVar4 = (uint)in_stack_00000008;
  bVar3 = QWindowSystemInterface::handleKeyEvent<QWindowSystemInterface::DefaultDelivery>
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
                     (KeyboardModifiers)in_stack_ffffffffffffff3c.i,
                     (QString *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     SUB81((ulong)in_RDI >> 0x38,0),in_stack_ffffffffffffff50);
  if ((bool)bVar3) {
    QCoreApplication::sendPostedEvents((QObject *)0x0,0);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    lcQtGuiTest();
    anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT17(bVar1,CONCAT16(bVar3,CONCAT15(in_stack_ffffffffffffff05,
                                                      CONCAT14(in_stack_ffffffffffffff04,
                                                               in_stack_ffffffffffffff00)))),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffefc,uVar4));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
      anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x4248a5);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_ESI,in_EDX),(char *)in_R8,
                 CONCAT13(bVar1,CONCAT12(bVar3,CONCAT11(in_stack_ffffffffffffff05,
                                                        in_stack_ffffffffffffff04))),
                 (char *)CONCAT44(in_stack_fffffffffffffefc,uVar4),(char *)0x4248bb);
      QMessageLogger::debug();
      QDebug::operator<<(in_RDI,in_stack_ffffffffffffff48);
      QDebug::~QDebug(&local_98);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    lcQtGuiTest();
    anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT17(bVar1,CONCAT16(bVar3,CONCAT15(in_stack_ffffffffffffff05,
                                                      CONCAT14(in_stack_ffffffffffffff04,
                                                               in_stack_ffffffffffffff00)))),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffefc,uVar4));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
      anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x424947);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_ESI,in_EDX),(char *)in_R8,
                 CONCAT13(bVar1,CONCAT12(bVar3,CONCAT11(in_stack_ffffffffffffff05,
                                                        in_stack_ffffffffffffff04))),
                 (char *)CONCAT44(in_stack_fffffffffffffefc,uVar4),(char *)0x42495d);
      QMessageLogger::debug();
      QDebug::operator<<(in_RDI,in_stack_ffffffffffffff48);
      QDebug::~QDebug(&local_c0);
      local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool QtGuiTest::synthesizeKeyEvent(QWindow *window, QEvent::Type t, int k, Qt::KeyboardModifiers mods,
                                          const QString & text, bool autorep,
                                          ushort count)
{
    Q_ASSERT_X((t == QEvent::KeyPress
                || t == QEvent::KeyRelease),
               Q_FUNC_INFO,
               "called with invalid QEvent type");

    deb << "Synthesizing key event:" << t << Qt::Key(k) << mods << text;

    bool result = QWindowSystemInterface::handleKeyEvent(window, t, k, mods, text, autorep, count);
    if (result) {
        // If the key event is a shortcut, it may cause other events to be posted.
        // => process those.
        QCoreApplication::sendPostedEvents();
        deb << "(success)";
    } else {
        deb << "(failure)";
    }

    return result;
}